

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_innerproduct.cpp
# Opt level: O0

int test_innerproduct(Mat *a,int outch,int bias)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  int iVar4;
  uint64_t uVar5;
  float *pfVar6;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  float fVar7;
  double dVar8;
  int ret;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  Mat activation_params;
  int activation_type;
  ParamDict pd;
  undefined4 in_stack_fffffffffffff528;
  int in_stack_fffffffffffff52c;
  undefined4 in_stack_fffffffffffff530;
  undefined4 in_stack_fffffffffffff534;
  undefined4 in_stack_fffffffffffff538;
  int in_stack_fffffffffffff53c;
  float in_stack_fffffffffffff540;
  float in_stack_fffffffffffff544;
  size_type in_stack_fffffffffffff548;
  int iVar9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff570;
  uint uVar10;
  undefined4 in_stack_fffffffffffff574;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_978;
  Mat local_960;
  int local_920;
  Allocator *in_stack_fffffffffffff7a8;
  float in_stack_fffffffffffff7b4;
  Mat *in_stack_fffffffffffff7b8;
  Option *in_stack_fffffffffffff7c0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff7c8;
  ParamDict *in_stack_fffffffffffff7d0;
  int *in_stack_fffffffffffff7d8;
  
  ncnn::ParamDict::ParamDict
            ((ParamDict *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6f0,0,in_ESI);
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6f0,1,in_EDX);
  ncnn::ParamDict::set
            ((ParamDict *)&stack0xfffffffffffff6f0,2,
             in_ESI * *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x30) * *(int *)(in_RDI + 0x34));
  uVar5 = prng_rand(&g_prng_rand_state);
  local_920 = (int)uVar5 + (int)(uVar5 / 5) * -5;
  ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 in_stack_fffffffffffff53c,
                 CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                 (Allocator *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  fVar7 = RandomFloat(in_stack_fffffffffffff544,in_stack_fffffffffffff540);
  pfVar6 = ncnn::Mat::operator[](&local_960,0);
  *pfVar6 = fVar7;
  fVar7 = RandomFloat(in_stack_fffffffffffff544,in_stack_fffffffffffff540);
  pfVar6 = ncnn::Mat::operator[](&local_960,1);
  *pfVar6 = fVar7;
  ncnn::ParamDict::set((ParamDict *)&stack0xfffffffffffff6f0,9,local_920);
  ncnn::ParamDict::set
            ((ParamDict *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
             in_stack_fffffffffffff52c,(Mat *)0x117ea8);
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x117ed4);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_fffffffffffff550,in_stack_fffffffffffff548,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
  iVar9 = (int)(in_stack_fffffffffffff548 >> 0x20);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x117efa);
  RandomMat(iVar9);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_978,0);
  ncnn::Mat::operator=
            ((Mat *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
             (Mat *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
  ncnn::Mat::~Mat((Mat *)0x117f5a);
  if (in_EDX != 0) {
    RandomMat(iVar9);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_978,1);
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
               (Mat *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
    ncnn::Mat::~Mat((Mat *)0x117faf);
  }
  ncnn::Option::Option((Option *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
  iVar4 = test_layer<ncnn::InnerProduct>
                    ((char *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
                     in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                     in_stack_fffffffffffff7b4,
                     (_func_void_InnerProduct_ptr *)in_stack_fffffffffffff7a8);
  iVar9 = local_920;
  __stream = _stderr;
  if (iVar4 != 0) {
    uVar1 = *(uint *)(in_RDI + 0x28);
    uVar2 = *(uint *)(in_RDI + 0x2c);
    uVar3 = *(uint *)(in_RDI + 0x30);
    uVar10 = *(uint *)(in_RDI + 0x34);
    pfVar6 = ncnn::Mat::operator[](&local_960,0);
    dVar8 = (double)*pfVar6;
    pfVar6 = ncnn::Mat::operator[](&local_960,1);
    fprintf(__stream,
            "test_innerproduct failed a.dims=%d a=(%d %d %d) outch=%d bias=%d act=%d actparams=[%f,%f]\n"
            ,dVar8,(double)*pfVar6,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar10,in_ESI,
            in_EDX,iVar9);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT44(iVar4,in_stack_fffffffffffff540));
  ncnn::Mat::~Mat((Mat *)0x118203);
  ncnn::ParamDict::~ParamDict((ParamDict *)CONCAT44(iVar4,in_stack_fffffffffffff540));
  return iVar4;
}

Assistant:

static int test_innerproduct(const ncnn::Mat& a, int outch, int bias)
{
    ncnn::ParamDict pd;
    pd.set(0, outch);// num_output
    pd.set(1, bias);// bias_term
    pd.set(2, outch*a.w*a.h*a.c);

    int activation_type = RAND() % 5;// 0 1 2 3 4
    ncnn::Mat activation_params(2);
    activation_params[0] = RandomFloat(-1, 0);// alpha
    activation_params[1] = RandomFloat(0, 1);// beta
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    std::vector<ncnn::Mat> weights(bias ? 2 : 1);
    weights[0] = RandomMat(outch*a.w*a.h*a.c);
    if (bias)
        weights[1] = RandomMat(outch);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::InnerProduct>("InnerProduct", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_innerproduct failed a.dims=%d a=(%d %d %d) outch=%d bias=%d act=%d actparams=[%f,%f]\n", a.dims, a.w, a.h, a.c, outch, bias, activation_type, activation_params[0], activation_params[1]);
    }

    return ret;
}